

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O2

bool __thiscall sglr::rc::Texture2DArray::isComplete(Texture2DArray *this)

{
  ChannelType *pCVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  TextureFormat *format;
  int *piVar10;
  size_t *psVar11;
  int iVar12;
  uint uVar13;
  
  uVar2 = (this->super_Texture).m_baseLevel;
  uVar8 = (ulong)uVar2;
  if (0xd < uVar8) {
    return false;
  }
  if ((this->m_levels).m_data[uVar8].m_cap == 0) {
    bVar7 = false;
  }
  else {
    bVar7 = true;
    if (LINEAR < (this->super_Texture).m_sampler.minFilter) {
      uVar3 = (this->m_levels).m_access[uVar8].super_ConstPixelBufferAccess.m_size.m_data[0];
      uVar4 = (this->m_levels).m_access[uVar8].super_ConstPixelBufferAccess.m_size.m_data[1];
      iVar12 = ((this->super_Texture).m_maxLevel - uVar2) + 1;
      uVar5 = uVar4;
      if ((int)uVar4 < (int)uVar3) {
        uVar5 = uVar3;
      }
      uVar13 = 0x20;
      if (uVar5 != 0) {
        uVar13 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        uVar13 = uVar13 ^ 0x1f;
      }
      iVar6 = 0x20 - uVar13;
      if (iVar12 < (int)(0x20 - uVar13)) {
        iVar6 = iVar12;
      }
      psVar11 = &(this->m_levels).m_data[uVar8 + 1].m_cap;
      uVar9 = 1;
      piVar10 = (this->m_levels).m_access[uVar8 + 1].super_ConstPixelBufferAccess.m_size.m_data + 2;
      while (((bVar7 = (long)iVar6 <= (long)uVar9, (long)uVar9 < (long)iVar6 &&
              (0xe - uVar2 != uVar9)) && (*psVar11 != 0))) {
        iVar12 = (int)uVar3 >> ((byte)uVar9 & 0x1f);
        if (iVar12 < 2) {
          iVar12 = 1;
        }
        if (((IVec3 *)(piVar10 + -2))->m_data[0] != iVar12) {
          return bVar7;
        }
        iVar12 = (int)uVar4 >> ((byte)uVar9 & 0x1f);
        if (iVar12 < 2) {
          iVar12 = 1;
        }
        if (piVar10[-1] != iVar12) {
          return bVar7;
        }
        if (*piVar10 !=
            (this->m_levels).m_access[uVar8].super_ConstPixelBufferAccess.m_size.m_data[2]) {
          return bVar7;
        }
        if (piVar10[-4] !=
            (this->m_levels).m_access[uVar8].super_ConstPixelBufferAccess.m_format.order) {
          return bVar7;
        }
        uVar9 = uVar9 + 1;
        psVar11 = psVar11 + 2;
        pCVar1 = (ChannelType *)(piVar10 + -3);
        piVar10 = piVar10 + 10;
        if (*pCVar1 != (this->m_levels).m_access[uVar8].super_ConstPixelBufferAccess.m_format.type)
        {
          return bVar7;
        }
      }
    }
  }
  return bVar7;
}

Assistant:

int							getMaxLevel		(void) const	{ return m_maxLevel;		}